

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O3

void __thiscall chrono::ChIterativeSolverLS::Solve(ChIterativeSolverLS *this)

{
  ChSystemDescriptor *in_RSI;
  
  Solve((ChIterativeSolverLS *)
        &this[-1].m_invdiag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
         .m_rows,in_RSI);
  return;
}

Assistant:

double ChIterativeSolverLS::Solve(ChSystemDescriptor& sysd) {
    // Assemble the problem right-hand side vector
    sysd.ConvertToMatrixForm(nullptr, &m_rhs);

    // Let the concrete solver compute the solution (in m_sol)
    bool result = SolveProblem();

    if (verbose) {
        // Calculate exact residual and report its norm
        ChVectorDynamic<> Ax(m_sol.size());
        sysd.SystemProduct(Ax, m_sol);
        std::cout << "  ||Ax-b|| = " << (Ax - m_rhs).norm() << std::endl;
    }

    //// DEBUGGING
    ////SaveMatrix(sysd);
    ////CheckSolution(sysd, m_sol);
    //// DEBUGGING

    // Scatter solution vector to the system descriptor
    sysd.FromVectorToUnknowns(m_sol);

    return result;
}